

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderFrameBorder(ImVec2 p_min,ImVec2 p_max,float rounding)

{
  float thickness;
  ImGuiWindow_conflict *pIVar1;
  ImDrawList *pIVar2;
  ImU32 IVar3;
  ImVec2 p_max_local;
  ImVec2 p_min_local;
  ImVec2 local_30;
  ImVec2 local_28;
  
  thickness = (GImGui->Style).FrameBorderSize;
  if (0.0 < thickness) {
    pIVar1 = GImGui->CurrentWindow;
    pIVar2 = pIVar1->DrawList;
    local_28.y = p_min.y + 1.0;
    local_28.x = p_min.x + 1.0;
    local_30.y = p_max.y + 1.0;
    local_30.x = p_max.x + 1.0;
    p_max_local = p_max;
    p_min_local = p_min;
    IVar3 = GetColorU32(6,1.0);
    ImDrawList::AddRect(pIVar2,&local_28,&local_30,IVar3,rounding,0,thickness);
    pIVar2 = pIVar1->DrawList;
    IVar3 = GetColorU32(5,1.0);
    ImDrawList::AddRect(pIVar2,&p_min_local,&p_max_local,IVar3,rounding,0,thickness);
  }
  return;
}

Assistant:

void ImGui::RenderFrameBorder(ImVec2 p_min, ImVec2 p_max, float rounding)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const float border_size = g.Style.FrameBorderSize;
    if (border_size > 0.0f)
    {
        window->DrawList->AddRect(p_min + ImVec2(1, 1), p_max + ImVec2(1, 1), GetColorU32(ImGuiCol_BorderShadow), rounding, 0, border_size);
        window->DrawList->AddRect(p_min, p_max, GetColorU32(ImGuiCol_Border), rounding, 0, border_size);
    }
}